

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O2

void stbi_decode_DXT_color_block(uchar *uncompressed,uchar *compressed)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uchar decode_colors [12];
  int b;
  int g;
  int r;
  
  uVar1 = *(ushort *)(compressed + 2);
  stbi_rgb_888_from_565((uint)*(ushort *)compressed,&r,&g,&b);
  iVar5 = r;
  uVar4 = (ushort)g;
  uVar3 = (ushort)b;
  decode_colors[0] = (uchar)r;
  decode_colors[1] = (uchar)(ushort)g;
  decode_colors[2] = (uchar)(ushort)b;
  stbi_rgb_888_from_565((uint)uVar1,&r,&g,&b);
  decode_colors[3] = (uchar)r;
  decode_colors[4] = (uchar)(ushort)g;
  decode_colors[5] = (uchar)(ushort)b;
  decode_colors[6] = (uchar)(((r & 0xffU) + (iVar5 & 0xffU) * 2) / 3);
  decode_colors[7] = (uchar)((ushort)(((ushort)g & 0xff) + (uVar4 & 0xff) * 2) / 3);
  decode_colors[8] = (uchar)((ushort)(((ushort)b & 0xff) + (uVar3 & 0xff) * 2) / 3);
  decode_colors[9] = (uchar)((ushort)((short)(iVar5 & 0xffU) + (short)(r & 0xffU) * 2) / 3);
  decode_colors[10] = (uchar)((ushort)((uVar4 & 0xff) + ((ushort)g & 0xff) * 2) / 3);
  decode_colors[0xb] = (uchar)((ushort)((uVar3 & 0xff) + ((ushort)b & 0xff) * 2) / 3);
  uVar6 = 0x20;
  for (uVar7 = 0; uVar7 < 0x40; uVar7 = uVar7 + 4) {
    lVar2 = (ulong)(compressed[uVar6 >> 3] >> ((byte)uVar6 & 6) & 3) * 3;
    uVar6 = (ulong)((int)uVar6 + 2);
    uncompressed[uVar7] = decode_colors[lVar2];
    uncompressed[uVar7 + 1] = decode_colors[lVar2 + 1];
    uncompressed[uVar7 + 2] = decode_colors[lVar2 + 2];
  }
  return;
}

Assistant:

void stbi_decode_DXT_color_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*3];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[3] = r;
	decode_colors[4] = g;
	decode_colors[5] = b;
	//	Like DXT1, but no choicees:
	//	no alpha, 2 interpolated colors
	decode_colors[6] = (2*decode_colors[0] + decode_colors[3]) / 3;
	decode_colors[7] = (2*decode_colors[1] + decode_colors[4]) / 3;
	decode_colors[8] = (2*decode_colors[2] + decode_colors[5]) / 3;
	decode_colors[9] = (decode_colors[0] + 2*decode_colors[3]) / 3;
	decode_colors[10] = (decode_colors[1] + 2*decode_colors[4]) / 3;
	decode_colors[11] = (decode_colors[2] + 2*decode_colors[5]) / 3;
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 3;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
	}
	//	done
}